

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::printFloatDeclaration
               (ostringstream *oss,string *varName,bool uniform,GLfloat value)

{
  ostream *poVar1;
  int precision;
  string local_158;
  Layout local_134;
  VariableDeclaration local_120;
  Layout local_ac;
  VariableDeclaration local_98;
  undefined1 local_38 [8];
  VarType varType;
  GLfloat value_local;
  bool uniform_local;
  string *varName_local;
  ostringstream *oss_local;
  
  varType.m_data.array.size = (int)value;
  varType.m_data._15_1_ = uniform;
  glu::VarType::VarType((VarType *)local_38,TYPE_FLOAT,PRECISION_HIGHP);
  if ((varType.m_data._15_1_ & 1) == 0) {
    glu::Layout::Layout(&local_134,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_120,(VarType *)local_38,varName,STORAGE_CONST,INTERPOLATION_LAST,&local_134,0)
    ;
    poVar1 = glu::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,&local_120);
    poVar1 = std::operator<<(poVar1," = ");
    de::floatToString_abi_cxx11_(&local_158,(de *)0x6,(float)varType.m_data.array.size,precision);
    poVar1 = std::operator<<(poVar1,(string *)&local_158);
    std::operator<<(poVar1,";\n");
    std::__cxx11::string::~string((string *)&local_158);
    glu::VariableDeclaration::~VariableDeclaration(&local_120);
  }
  else {
    glu::Layout::Layout(&local_ac,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_98,(VarType *)local_38,varName,STORAGE_UNIFORM,INTERPOLATION_LAST,&local_ac,0)
    ;
    poVar1 = glu::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,&local_98);
    std::operator<<(poVar1,";\n");
    glu::VariableDeclaration::~VariableDeclaration(&local_98);
  }
  glu::VarType::~VarType((VarType *)local_38);
  return;
}

Assistant:

void printFloatDeclaration (ostringstream&	oss,
							const string&	varName,
							bool			uniform,
							GLfloat			value		= 0.0)
{
	using namespace glu;

	const VarType	varType	(TYPE_FLOAT, PRECISION_HIGHP);

	if (uniform)
		oss << VariableDeclaration(varType, varName, STORAGE_UNIFORM) << ";\n";
	else
		oss << VariableDeclaration(varType, varName, STORAGE_CONST)
			<< " = " << de::floatToString(value, 6) << ";\n";
}